

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.h
# Opt level: O2

void __thiscall Heap<SAT::VarOrderLt>::percolateDown(Heap<SAT::VarOrderLt> *this,int i)

{
  uint uVar1;
  vec<double> *pvVar2;
  int *piVar3;
  int *piVar4;
  ulong uVar5;
  double dVar6;
  double *pdVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  double dVar12;
  
  pvVar2 = (this->lt).activity;
  piVar3 = (this->heap).data;
  uVar1 = piVar3[(uint)i];
  piVar4 = (this->indices).data;
  while( true ) {
    uVar9 = i * 2 + 1;
    uVar11 = (this->heap).sz;
    if ((int)uVar11 <= (int)uVar9) break;
    uVar8 = i * 2 + 2;
    if ((int)uVar8 < (int)uVar11) {
      uVar11 = piVar3[uVar8];
      uVar10 = (ulong)uVar11;
      pdVar7 = pvVar2->data;
      dVar12 = pdVar7[uVar10];
      uVar5 = (ulong)(uint)piVar3[uVar9];
      dVar6 = pdVar7[(uint)piVar3[uVar9]];
      if (dVar12 <= pdVar7[(uint)piVar3[uVar9]]) goto LAB_0019d17d;
    }
    else {
      pdVar7 = pvVar2->data;
      uVar5 = (ulong)(uint)piVar3[uVar9];
      dVar6 = pdVar7[(uint)piVar3[uVar9]];
LAB_0019d17d:
      dVar12 = dVar6;
      uVar10 = uVar5;
      uVar11 = (uint)uVar10;
      uVar8 = uVar9;
    }
    if (dVar12 < pdVar7[uVar1] || dVar12 == pdVar7[uVar1]) break;
    piVar3[(uint)i] = uVar11;
    piVar4[uVar10] = i;
    i = uVar8;
  }
  piVar3[(uint)i] = uVar1;
  piVar4[uVar1] = i;
  return;
}

Assistant:

inline void percolateDown(int i) {
		const int x = heap[i];
		while (left(i) < static_cast<int>(heap.size())) {
			const int child =
					right(i) < static_cast<int>(heap.size()) && lt(heap[right(i)], heap[left(i)]) ? right(i)
																																												: left(i);
			if (!lt(heap[child], x)) {
				break;
			}
			heap[i] = heap[child];
			indices[heap[i]] = i;
			i = child;
		}
		heap[i] = x;
		indices[x] = i;
	}